

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.hpp
# Opt level: O2

GlobalPtr<int> BCL::local_malloc<int>(size_t size)

{
  ulong uVar1;
  ulong uVar2;
  ulong *puVar3;
  size_t sVar4;
  ulong *puVar5;
  ulong uVar6;
  ulong *puVar7;
  size_t sVar8;
  GlobalPtr<int> GVar9;
  
  if (bcl_finalized == '\0') {
    std::mutex::lock((mutex *)malloc_mutex);
    puVar5 = smem_heap;
    uVar2 = size * 4 + 0x3f & 0xffffffffffffffc0;
    for (puVar7 = (ulong *)&flist; puVar7 = (ulong *)*puVar7, puVar7 != (ulong *)0x0;
        puVar7 = puVar7 + 2) {
      uVar1 = *puVar7;
      if (uVar2 <= uVar1) {
        if (uVar2 + 0x80 < uVar1) {
          puVar5 = (ulong *)((long)puVar7 + uVar2 + 0x40);
          *puVar5 = (uVar1 - uVar2) - 0x40;
          uVar1 = puVar7[1];
          *(ulong *)((long)puVar7 + uVar2 + 0x48) = uVar1;
          uVar6 = puVar7[2];
          *(ulong *)((long)puVar7 + uVar2 + 0x50) = uVar6;
          if (uVar1 != 0) {
            *(ulong **)(uVar1 + 0x10) = puVar5;
            uVar6 = puVar7[2];
          }
          if (uVar6 != 0) {
            *(ulong **)(uVar6 + 8) = puVar5;
          }
          *puVar7 = uVar2;
          puVar7[1] = 0;
          puVar7[2] = 0;
          puVar3 = smem_heap;
          if (puVar7 == flist) {
            flist = puVar5;
          }
        }
        else {
          uVar2 = puVar7[1];
          puVar5 = (ulong *)puVar7[2];
          if (uVar2 != 0) {
            *(ulong **)(uVar2 + 0x10) = puVar5;
          }
          if (puVar5 != (ulong *)0x0) {
            puVar5[1] = uVar2;
          }
          if (puVar7 == flist) {
            flist = puVar5;
          }
          puVar7[1] = 0;
          puVar7[2] = 0;
          puVar3 = smem_heap;
        }
        goto LAB_00103403;
      }
    }
    *smem_heap = uVar2;
    puVar3 = (ulong *)((long)puVar5 + uVar2 + 0x40);
    puVar5[1] = 0;
    puVar5[2] = 0;
    puVar7 = puVar5;
    if (puVar3 <= (ulong *)(smem_base_ptr + shared_segment_size)) {
LAB_00103403:
      smem_heap = puVar3;
      pthread_mutex_unlock((pthread_mutex_t *)malloc_mutex);
      sVar8 = (long)puVar7 + (0x40 - smem_base_ptr);
      sVar4 = my_rank;
      goto LAB_0010341d;
    }
    pthread_mutex_unlock((pthread_mutex_t *)malloc_mutex);
  }
  sVar4 = 0;
  sVar8 = 0;
LAB_0010341d:
  GVar9.ptr = sVar8;
  GVar9.rank = sVar4;
  return GVar9;
}

Assistant:

inline GlobalPtr <T> local_malloc(size_t size) {
  if (bcl_finalized) {
    return nullptr;
  }
  BCL::malloc_mutex.lock();
  size = size * sizeof(T);
  // Align size
  size = ((size + SMALLEST_MEM_UNIT - 1) / SMALLEST_MEM_UNIT) * SMALLEST_MEM_UNIT;

  chunk_t *chunk = flist;

  while (chunk != NULL) {
    if (chunk->size >= size) {
      break;
    }
    chunk = chunk->next;
  }

  char *allocd = nullptr;
  if (chunk != NULL && chunk->size >= size) {
    // I have a chunk!
    if (chunk->size > SMALLEST_MEM_UNIT + size + chunk_t_size()) {
      // Chunk is too big; carve off my piece and
      // replace it with free_chunk in the flist.
      chunk_t *free_chunk = (chunk_t *) (((char *) chunk) + chunk_t_size() + size);
      free_chunk->size = chunk->size - size - chunk_t_size();
      free_chunk->last = chunk->last;
      free_chunk->next = chunk->next;
      if (chunk->last != NULL) {
        chunk->last->next = free_chunk;
      }
      if (chunk->next != NULL) {
        chunk->next->last = free_chunk;
      }
      chunk->size = size;
      chunk->next = NULL;
      chunk->last = NULL;
      if (chunk == flist) {
        flist = free_chunk;
      }
    } else {
      // Chunk is just the right size; carve it
      // off and close the hole in the flist.
      if (chunk->last != NULL) {
        chunk->last->next = chunk->next;
      }
      if (chunk->next != NULL) {
        chunk->next->last = chunk->last;
      }
      if (chunk == flist) {
        flist = chunk->next;
      }
      chunk->last = NULL;
      chunk->next = NULL;
    }
    allocd = ((char *) chunk) + chunk_t_size();
  } else {
    // No free chunk, carve one off the heap.
    chunk = BCL::smem_heap;
    chunk->size = size;
    chunk->next = NULL;
    chunk->last = NULL;
    allocd = ((char *) chunk) + chunk_t_size();
    if (allocd + size > ((char *) BCL::smem_base_ptr) + shared_segment_size) {
      BCL::malloc_mutex.unlock();
      return nullptr;
    } else {
      BCL::smem_heap = (chunk_t *) (((char *) allocd) + size);
    }
  }

  BCL::malloc_mutex.unlock();

  return GlobalPtr <T> (BCL::rank(), (uint64_t) (allocd - (char *) BCL::smem_base_ptr));
}